

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000016f570 = 0x2d2d2d2d2d2d2d;
    uRam000000000016f577 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0016f560 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000016f568 = 0x2d2d2d2d2d2d2d;
    DAT_0016f56f = 0x2d;
    _DAT_0016f550 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000016f558 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0016f540 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000016f548 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam000000000016f538 = 0x2d2d2d2d2d2d2d2d;
    DAT_0016f57f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }